

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobSubstitution.hpp
# Opt level: O3

Option<Kernel::TermList> __thiscall
Kernel::OnlyMemorizeNonVar<Kernel::TermList>::get
          (OnlyMemorizeNonVar<Kernel::TermList> *this,AutoDerefTermSpec *arg)

{
  undefined1 uVar1;
  Value in_RDX;
  Value extraout_RDX;
  Option<Kernel::TermList> OVar2;
  undefined8 *local_30;
  undefined1 local_28;
  Entry *local_20;
  int local_18;
  
  local_20 = *(Entry **)in_RDX;
  if (((ulong)local_20 & 3) == 0) {
    local_18 = *(int *)((long)in_RDX + 8);
    local_28 = 1;
    Lib::Map<Kernel::TermSpec,_Kernel::TermList,_Lib::DefaultHash>::tryGet
              ((Map<Kernel::TermSpec,_Kernel::TermList,_Lib::DefaultHash> *)&local_30,&arg->term);
    in_RDX = extraout_RDX;
    if (local_30 != (undefined8 *)0x0) {
      (this->_memo)._entries = (Entry *)*local_30;
      uVar1 = 1;
      goto LAB_005ac8ef;
    }
  }
  (this->_memo)._capacity = 0;
  (this->_memo)._noOfEntries = 0;
  (this->_memo)._entries = (Entry *)0x0;
  uVar1 = 0;
LAB_005ac8ef:
  *(undefined1 *)&(this->_memo)._capacity = uVar1;
  OVar2.super_OptionBase<Kernel::TermList>._elem._elem = in_RDX;
  OVar2.super_OptionBase<Kernel::TermList>._0_8_ = this;
  return (Option<Kernel::TermList>)OVar2.super_OptionBase<Kernel::TermList>;
}

Assistant:

Option<Result> get(AutoDerefTermSpec const& arg)
  { 
    auto key = memoKey(arg);
    return key.isSome()
       ? _memo.tryGet(*key).toOwned()
       : Option<Result>(); 
  }